

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_critical_rate_simulation.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  unsigned_long uVar2;
  ostream *poVar3;
  size_t sVar4;
  rep rVar5;
  reference puVar6;
  void *this;
  string *generalProgramDescriptionForHelpText;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double avg_rate;
  double avg_synd_size;
  unsigned_long s;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  duration<long,_std::ratio<1L,_1L>_> local_cb0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_ca8;
  time_point now;
  vector<unsigned_long,_std::allocator<unsigned_long>_> syndrome_size_success;
  time_point begin;
  mt19937_64 rng;
  RateAdaptiveCode<unsigned_int> H;
  string local_238;
  undefined1 local_218 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rate_adaption_file_path;
  string local_1f0;
  undefined1 local_1d0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> code_file_path;
  string local_1a8;
  unsigned_long local_188;
  unsigned_long update_console_every_n_frames;
  string local_178;
  unsigned_long local_158;
  unsigned_long rng_seed;
  string local_148;
  unsigned_long local_128;
  unsigned_long max_bp_iter;
  string local_118;
  unsigned_long local_f8;
  unsigned_long num_frames_to_test;
  string local_e8;
  double local_c8;
  double p;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  Parser parser;
  char **argv_local;
  int argc_local;
  
  parser._commands.
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "Slepian-Wolf Critical Code Rate Simulator for Rate Adapted LDPC Codes\n\nIn a Slepian-Wolf coding setting, for a given codeword and noised codeword, there is a minimum coding rate at which the syndrome decoding succeeds.\nThis program determines the average minimum coding rate across many noised codewords."
             ,&local_a9);
  generalProgramDescriptionForHelpText = &local_a8;
  cli::Parser::Parser((Parser *)local_88,argc,argv,generalProgramDescriptionForHelpText);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  configure_parser((Parser *)local_88);
  cli::Parser::run_and_exit_if_error((Parser *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"p",(allocator<char> *)((long)&num_frames_to_test + 7));
  dVar7 = cli::Parser::get<double>((Parser *)local_88,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&num_frames_to_test + 7));
  local_c8 = dVar7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"nf",(allocator<char> *)((long)&max_bp_iter + 7));
  uVar2 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&max_bp_iter + 7));
  local_f8 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"i",(allocator<char> *)((long)&rng_seed + 7));
  uVar2 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rng_seed + 7));
  local_128 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"s",(allocator<char> *)((long)&update_console_every_n_frames + 7))
  ;
  uVar2 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&update_console_every_n_frames + 7));
  local_158 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"upn",
             (allocator<char> *)(code_file_path.field_2._M_local_buf + 0xf));
  uVar2 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)(code_file_path.field_2._M_local_buf + 0xf));
  local_188 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"cp",
             (allocator<char> *)(rate_adaption_file_path.field_2._M_local_buf + 0xf));
  cli::Parser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
             (Parser *)local_88,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(rate_adaption_file_path.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"rp",(allocator<char> *)((long)&H.n_ra_rows + 7));
  cli::Parser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
             (Parser *)local_88,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&H.n_ra_rows + 7));
  LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
            ((RateAdaptiveCode<unsigned_int> *)&rng._M_p,(CodeSimulationHelpers *)local_1d0,
             (string *)local_218,generalProgramDescriptionForHelpText);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"LDPC Code loaded from file: ");
  poVar3 = std::operator<<(poVar3,(string *)local_1d0);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Rate adaption loaded from file: ");
  poVar3 = std::operator<<(poVar3,(string *)local_218);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Code size: ");
  sVar4 = LDPC4QKD::RateAdaptiveCode<unsigned_int>::get_n_rows_after_rate_adaption
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  poVar3 = std::operator<<(poVar3," x ");
  sVar4 = LDPC4QKD::RateAdaptiveCode<unsigned_int>::getNCols
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Running FER decoding test on channel parameter p : ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_c8);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Max number decoder iterations: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)local_128);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Number of frames to simulate: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f8);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"PRNG seed: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_158);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"\n");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&begin,local_158);
  syndrome_size_success.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::chrono::_V2::steady_clock::now();
  run_simulation<LDPC4QKD::RateAdaptiveCode<unsigned_int>>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&now,
             (RateAdaptiveCode<unsigned_int> *)&rng._M_p,local_c8,local_f8,(mt19937_64 *)&begin,
             local_128,local_188);
  local_ca8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  poVar3 = std::operator<<((ostream *)&std::cout,"\n\nDONE! Simulation time: ");
  __range1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::chrono::operator-
                       (&local_ca8,
                        (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&syndrome_size_success.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_cb0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)&__range1);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_cb0);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,rVar5);
  poVar3 = std::operator<<(poVar3," seconds.");
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"all syndrome sizes:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&now);
  s = (unsigned_long)
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&now);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      (&__end1,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&s);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end1);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*puVar6);
    std::operator<<(poVar3,' ');
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n\n");
  dVar7 = LDPC4QKD::CodeSimulationHelpers::avg<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&now);
  poVar3 = std::operator<<((ostream *)&std::cout,"Average syndrome size (out of ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_f8);
  poVar3 = std::operator<<(poVar3," codewords tried): ");
  this = (void *)std::ostream::operator<<(poVar3,dVar7);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  sVar4 = LDPC4QKD::RateAdaptiveCode<unsigned_int>::getNCols
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p);
  auVar9._8_4_ = (int)(sVar4 >> 0x20);
  auVar9._0_8_ = sVar4;
  auVar9._12_4_ = 0x45300000;
  dVar7 = dVar7 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
  poVar3 = std::operator<<((ostream *)&std::cout,"Average rate: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
  poVar3 = std::operator<<(poVar3," (inefficiency f = ");
  dVar8 = LDPC4QKD::CodeSimulationHelpers::h2<double>(local_c8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7 / dVar8);
  poVar3 = std::operator<<(poVar3,")");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

int main(int argc, char *argv[]) {
    // parse command line arguments
    cli::Parser parser(argc, argv, help_text);
    configure_parser(parser);
    parser.run_and_exit_if_error();

    auto p = parser.get<double>("p");
    auto num_frames_to_test = parser.get<std::size_t>("nf");
    auto max_bp_iter = parser.get<std::size_t>("i");
    auto rng_seed = parser.get<std::size_t>("s");
    auto update_console_every_n_frames = parser.get<std::size_t>("upn");
    auto code_file_path = parser.get<std::string>("cp");;
    auto rate_adaption_file_path = parser.get<std::string>("rp");;

    auto H = load_ldpc(code_file_path, rate_adaption_file_path);

    std::cout << std::endl;
    std::cout << "LDPC Code loaded from file: " << code_file_path << '\n';
    std::cout << "Rate adaption loaded from file: " << rate_adaption_file_path << '\n';
    std::cout << "Code size: " << H.get_n_rows_after_rate_adaption() << " x " << H.getNCols() << '\n';
    std::cout << "Running FER decoding test on channel parameter p : " << p << '\n';
    std::cout << "Max number decoder iterations: " << static_cast<int>(max_bp_iter) << '\n';
    std::cout << "Number of frames to simulate: " << num_frames_to_test << '\n';
    std::cout << "PRNG seed: " << rng_seed << '\n';
    std::cout << "\n" << std::endl;

    std::mt19937_64 rng(rng_seed);
    auto begin = std::chrono::steady_clock::now();

    auto syndrome_size_success = run_simulation(
            H, p, num_frames_to_test, rng,
            max_bp_iter, update_console_every_n_frames);

    auto now = std::chrono::steady_clock::now();
    std::cout << "\n\nDONE! Simulation time: " <<
              std::chrono::duration_cast<std::chrono::seconds>(now - begin).count() << " seconds." << '\n';


    std::cout << "all syndrome sizes:" << std::endl;
    for (auto s : syndrome_size_success) {
        std::cout << s << ' ';
    }
    std::cout << "\n\n";

    double avg_synd_size = avg(syndrome_size_success);
    std::cout << "Average syndrome size (out of " << num_frames_to_test << " codewords tried): " << avg_synd_size
              << std::endl;

    double avg_rate = avg_synd_size / static_cast<double>(H.getNCols());
    std::cout << "Average rate: " << avg_rate << " (inefficiency f = " << avg_rate / h2(p) << ")" << std::endl;
    exit(EXIT_SUCCESS);
}